

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O1

void __thiscall chrono::fea::ChElementHexaANCF_3843::SetupInitial(ChElementHexaANCF_3843 *this)

{
  undefined1 *this_00;
  
  this_00 = &this[-1].field_0x15f8;
  CalcCoordMatrix((ChElementHexaANCF_3843 *)this_00,
                  (Matrix3xN *)
                  ((this->m_GravForceScale).
                   super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
                   array + 0x1f));
  ComputeMassMatrixAndGravityForce((ChElementHexaANCF_3843 *)this_00);
  PrecomputeInternalForceMatricesWeights((ChElementHexaANCF_3843 *)this_00);
  return;
}

Assistant:

void ChElementHexaANCF_3843::SetupInitial(ChSystem* system) {
    // Store the initial nodal coordinates. These values define the reference configuration of the element.
    CalcCoordMatrix(m_ebar0);

    // Compute and store the constant mass matrix and the matrix used to multiply the acceleration due to gravity to get
    // the generalized gravitational force vector for the element
    ComputeMassMatrixAndGravityForce();

    // Compute any required matrices and vectors for the generalized internal force and Jacobian calculations
    PrecomputeInternalForceMatricesWeights();
}